

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::fragment_index::fragment_index
          (fragment_index *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction,
          not_null<const_string_mapping_*> names)

{
  fragment_index *this_local;
  not_null<const_string_mapping_*> names_local;
  not_null<transaction_base_*> transaction_local;
  not_null<context_*> ctxt_local;
  
  rule::rule(&this->super_rule,ctxt);
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__fragment_index_003f7a30;
  (this->transaction_).ptr_ = transaction.ptr_;
  (this->names_).ptr_ = names.ptr_;
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::vector(&this->sections_);
  uint128::uint128(&this->digest_);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::reserve(&this->sections_,0x13);
  return;
}

Assistant:

fragment_index::fragment_index (not_null<context *> const ctxt,
                                            not_null<transaction_base *> const transaction,
                                            not_null<string_mapping const *> const names)
                    : rule (ctxt)
                    , transaction_{transaction}
                    , names_{names} {
                sections_.reserve (static_cast<std::underlying_type_t<repo::section_kind>> (
                    repo::section_kind::last));
            }